

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

void construct_etag(char *buf,size_t buf_len,mg_file_stat *filestat)

{
  mg_file_stat *filestat_local;
  size_t buf_len_local;
  char *buf_local;
  
  if ((filestat != (mg_file_stat *)0x0) && (buf != (char *)0x0)) {
    mg_snprintf((mg_connection *)0x0,(int *)0x0,buf,buf_len,"\"%lx.%ld\"",filestat->last_modified,
                filestat->size);
  }
  return;
}

Assistant:

static void
construct_etag(char *buf, size_t buf_len, const struct mg_file_stat *filestat)
{
	if ((filestat != NULL) && (buf != NULL)) {
		mg_snprintf(NULL,
		            NULL, /* All calls to construct_etag use 64 byte buffer */
		            buf,
		            buf_len,
		            "\"%lx.%" INT64_FMT "\"",
		            (unsigned long)filestat->last_modified,
		            filestat->size);
	}
}